

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::EnumNonLiteGenerator::EnumNonLiteGenerator
          (EnumNonLiteGenerator *this,EnumDescriptor *descriptor,bool immutable_api,Context *context
          )

{
  ClassNameResolver *pCVar1;
  EnumValueDescriptor *pEVar2;
  int i;
  int index;
  EnumValueDescriptor *value;
  Alias alias;
  EnumValueDescriptor *local_48;
  value_type local_40;
  
  (this->super_EnumGenerator)._vptr_EnumGenerator =
       (_func_int **)&PTR__EnumNonLiteGenerator_0168e6b8;
  this->descriptor_ = descriptor;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->canonical_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aliases_).
  super__Vector_base<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->immutable_api_ = immutable_api;
  this->context_ = context;
  pCVar1 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar1;
  for (index = 0; index < this->descriptor_->value_count_; index = index + 1) {
    local_48 = EnumDescriptor::value(this->descriptor_,index);
    pEVar2 = EnumDescriptor::FindValueByNumber(this->descriptor_,local_48->number_);
    if (local_48 == pEVar2) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(&this->canonical_values_,&local_48);
    }
    else {
      local_40.value = local_48;
      local_40.canonical_value = pEVar2;
      std::
      vector<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumNonLiteGenerator::Alias>_>
      ::push_back(&this->aliases_,&local_40);
    }
  }
  return;
}

Assistant:

EnumNonLiteGenerator::EnumNonLiteGenerator(const EnumDescriptor* descriptor,
                                           bool immutable_api, Context* context)
    : descriptor_(descriptor),
      immutable_api_(immutable_api),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      canonical_values_.push_back(value);
    } else {
      Alias alias;
      alias.value = value;
      alias.canonical_value = canonical_value;
      aliases_.push_back(alias);
    }
  }
}